

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::(anonymous_namespace)::GatherGeometryShader::FragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 400               \nin vec4 col;               \nout vec4 f_out_0;          \nvoid main() {              \n   f_out_0 = col;          \n}"
             ,&local_9);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string FragmentShader()
	{
		return "#version 400               \n"
			   "in vec4 col;               \n"
			   "out vec4 f_out_0;          \n"
			   "void main() {              \n"
			   "   f_out_0 = col;          \n"
			   "}";
	}